

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  byte *pbVar1;
  byte bVar2;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var3;
  LogMessage *pLVar4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar6;
  LogFinisher local_c9;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  local_c8.filename_ = (char *)0x0;
  local_c8.line_ = 0;
  local_c8._20_4_ = 0;
  local_c8.message_._M_dataplus._M_p = (pointer)0x0;
  local_c8.level_ = number;
  pVar6 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_c8);
  _Var3 = pVar6.first._M_node;
  _Var3._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var3._M_node[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x18e);
      pLVar4 = LogMessage::operator<<
                         (&local_90,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_c8,pLVar4);
      LogMessage::~LogMessage(&local_90);
    }
    bVar2 = *(byte *)&_Var3._M_node[1]._M_left;
    if ((byte)(bVar2 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar4 = LogMessage::operator<<
                         (&local_c8,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_58,pLVar4);
      LogMessage::~LogMessage(&local_c8);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) != 9) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x18e);
      pLVar4 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_c9,pLVar4);
      LogMessage::~LogMessage(&local_58);
    }
  }
  else {
    *(FieldType *)&_Var3._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar4 = LogMessage::operator<<
                         (&local_c8,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
      LogMessage::~LogMessage(&local_c8);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 9) {
      LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x18a);
      pLVar4 = LogMessage::operator<<
                         (&local_90,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_58,pLVar4);
      LogMessage::~LogMessage(&local_90);
    }
    *(undefined1 *)((long)&_Var3._M_node[1]._M_left + 1) = 0;
    p_Var5 = (_Base_ptr)operator_new(0x20);
    *(_Base_ptr **)p_Var5 = &p_Var5->_M_left;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&p_Var5->_M_left = 0;
    _Var3._M_node[1]._M_parent = p_Var5;
  }
  pbVar1 = (byte *)((long)&_Var3._M_node[1]._M_left + 2);
  *pbVar1 = *pbVar1 & 0xf0;
  return (string *)_Var3._M_node[1]._M_parent;
}

Assistant:

string* ExtensionSet::MutableString(int number, FieldType type,
                                    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = new string;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}